

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfHeader.cpp
# Opt level: O0

void __thiscall Imf_3_3::Header::sanityCheck(Header *this,bool isTiled,bool isMultipartFile)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  undefined8 uVar4;
  ostream *poVar5;
  int *piVar6;
  float *pfVar7;
  string *psVar8;
  LineOrder *pLVar9;
  Compression *pCVar10;
  Channel *pCVar11;
  char *pcVar12;
  stringstream *text;
  byte in_DL;
  byte in_SIL;
  stringstream _iex_throw_s_15;
  stringstream _iex_throw_s_14;
  stringstream _iex_throw_s_13;
  stringstream _iex_throw_s_12;
  stringstream _iex_throw_s_11;
  stringstream _iex_throw_s_10;
  stringstream _iex_throw_s_9;
  ConstIterator i_1;
  stringstream _iex_throw_s_8;
  stringstream _iex_throw_s_7;
  stringstream _iex_throw_s_6;
  ConstIterator i;
  stringstream _iex_throw_s_5;
  ChannelList *channels;
  stringstream _iex_throw_s_4;
  stringstream _iex_throw_s_3;
  TileDescription *tileDesc;
  LineOrder lineOrder;
  bool isDeep;
  string *part_type;
  float screenWindowWidth;
  float MAX_PIXEL_ASPECT_RATIO;
  float MIN_PIXEL_ASPECT_RATIO;
  float pixelAspectRatio;
  stringstream _iex_throw_s_2;
  stringstream _iex_throw_s_1;
  int h;
  stringstream _iex_throw_s;
  int w;
  Box2i *dataWindow;
  Box2i *displayWindow;
  stringstream *in_stack_ffffffffffffe358;
  string *in_stack_ffffffffffffe360;
  allocator<char> *in_stack_ffffffffffffe390;
  char *in_stack_ffffffffffffe398;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffe3a0;
  Header *in_stack_ffffffffffffe420;
  stringstream local_1948 [16];
  ostream local_1938 [376];
  stringstream local_17c0 [16];
  ostream local_17b0 [376];
  stringstream local_1638 [16];
  ostream local_1628 [376];
  stringstream local_14b0 [16];
  ostream local_14a0 [376];
  stringstream local_1328 [16];
  ostream local_1318 [376];
  stringstream local_11a0 [16];
  ostream local_1190 [376];
  stringstream local_1018 [16];
  ostream local_1008 [376];
  const_iterator local_e90;
  const_iterator local_e88;
  stringstream local_e80 [16];
  ostream local_e70 [376];
  stringstream local_cf8 [16];
  ostream local_ce8 [376];
  stringstream local_b70 [16];
  ostream local_b60 [376];
  const_iterator local_9e8;
  const_iterator local_9e0;
  stringstream local_9d8 [16];
  ostream local_9c8 [376];
  const_iterator local_850;
  const_iterator local_848;
  ChannelList *local_840;
  stringstream local_838 [16];
  ostream local_828 [376];
  stringstream local_6b0 [16];
  ostream local_6a0 [376];
  TileDescription *local_528;
  LineOrder local_520;
  byte local_519;
  undefined4 local_518;
  byte local_512;
  allocator<char> local_511;
  string local_510 [32];
  string *local_4f0;
  float local_4e8;
  undefined4 local_4e4;
  undefined4 local_4e0;
  float local_4dc;
  stringstream local_4d8 [16];
  ostream local_4c8 [376];
  stringstream local_350 [16];
  ostream local_340 [380];
  int local_1c4;
  stringstream local_1c0 [16];
  ostream local_1b0 [380];
  int local_34;
  Box2i *local_30;
  Box2i *local_18;
  byte local_a;
  byte local_9;
  
  local_9 = in_SIL & 1;
  local_a = in_DL & 1;
  local_18 = Header::displayWindow((Header *)0x12eb8c);
  if (((((local_18->max).x < (local_18->min).x) || ((local_18->max).y < (local_18->min).y)) ||
      ((local_18->min).x < -0x3ffffffe)) ||
     ((((local_18->min).y < -0x3ffffffe || (0x3ffffffe < (local_18->max).x)) ||
      (0x3ffffffe < (local_18->max).y)))) {
    uVar4 = __cxa_allocate_exception(0x48);
    Iex_3_3::ArgExc::ArgExc((ArgExc *)in_stack_ffffffffffffe360,(char *)in_stack_ffffffffffffe358);
    __cxa_throw(uVar4,&Iex_3_3::ArgExc::typeinfo,Iex_3_3::ArgExc::~ArgExc);
  }
  local_30 = Header::dataWindow((Header *)0x12ec7a);
  if ((((local_30->max).x < (local_30->min).x) || ((local_30->max).y < (local_30->min).y)) ||
     (((local_30->min).x < -0x3ffffffe ||
      ((((local_30->min).y < -0x3ffffffe || (0x3ffffffe < (local_30->max).x)) ||
       (0x3ffffffe < (local_30->max).y)))))) {
    uVar4 = __cxa_allocate_exception(0x48);
    Iex_3_3::ArgExc::ArgExc((ArgExc *)in_stack_ffffffffffffe360,(char *)in_stack_ffffffffffffe358);
    __cxa_throw(uVar4,&Iex_3_3::ArgExc::typeinfo,Iex_3_3::ArgExc::~ArgExc);
  }
  local_34 = ((local_30->max).x - (local_30->min).x) + 1;
  if ((0 < (anonymous_namespace)::maxImageWidth) &&
     ((anonymous_namespace)::maxImageWidth < local_34)) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream(local_1c0);
    poVar5 = std::operator<<(local_1b0,"The width of the data window exceeds the maximum width of ")
    ;
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,(anonymous_namespace)::maxImageWidth);
    std::operator<<(poVar5,"pixels.");
    uVar4 = __cxa_allocate_exception(0x48);
    Iex_3_3::ArgExc::ArgExc((ArgExc *)in_stack_ffffffffffffe360,in_stack_ffffffffffffe358);
    __cxa_throw(uVar4,&Iex_3_3::ArgExc::typeinfo,Iex_3_3::ArgExc::~ArgExc);
  }
  local_1c4 = ((local_30->max).y - (local_30->min).y) + 1;
  if ((0 < (anonymous_namespace)::maxImageHeight) &&
     ((anonymous_namespace)::maxImageHeight < local_1c4)) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream(local_350);
    poVar5 = std::operator<<(local_340,
                             "The height of the data window exceeds the maximum height of ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,(anonymous_namespace)::maxImageHeight);
    std::operator<<(poVar5,"pixels.");
    uVar4 = __cxa_allocate_exception(0x48);
    Iex_3_3::ArgExc::ArgExc((ArgExc *)in_stack_ffffffffffffe360,in_stack_ffffffffffffe358);
    __cxa_throw(uVar4,&Iex_3_3::ArgExc::typeinfo,Iex_3_3::ArgExc::~ArgExc);
  }
  if ((((0 < (anonymous_namespace)::maxImageHeight) && (0 < (anonymous_namespace)::maxImageWidth))
      && (bVar3 = hasChunkCount((Header *)0x12efeb), bVar3)) &&
     (piVar6 = chunkCount((Header *)0x12f001),
     (ulong)((long)(anonymous_namespace)::maxImageWidth *
            (long)(anonymous_namespace)::maxImageHeight) < (ulong)(long)*piVar6)) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream(local_4d8);
    poVar5 = std::operator<<(local_4c8,"chunkCount exceeds maximum area of ");
    poVar5 = (ostream *)
             std::ostream::operator<<
                       (poVar5,(long)(anonymous_namespace)::maxImageWidth *
                               (long)(anonymous_namespace)::maxImageHeight);
    std::operator<<(poVar5," pixels.");
    uVar4 = __cxa_allocate_exception(0x48);
    Iex_3_3::ArgExc::ArgExc((ArgExc *)in_stack_ffffffffffffe360,in_stack_ffffffffffffe358);
    __cxa_throw(uVar4,&Iex_3_3::ArgExc::typeinfo,Iex_3_3::ArgExc::~ArgExc);
  }
  pfVar7 = Header::pixelAspectRatio((Header *)0x12f12d);
  local_4dc = *pfVar7;
  local_4e0 = 0x358637bd;
  local_4e4 = 0x49742400;
  bVar3 = std::isnormal(local_4dc);
  if (((!bVar3) || (local_4dc < 1e-06)) || (1e+06 < local_4dc)) {
    uVar4 = __cxa_allocate_exception(0x48);
    Iex_3_3::ArgExc::ArgExc((ArgExc *)in_stack_ffffffffffffe360,(char *)in_stack_ffffffffffffe358);
    __cxa_throw(uVar4,&Iex_3_3::ArgExc::typeinfo,Iex_3_3::ArgExc::~ArgExc);
  }
  pfVar7 = Header::screenWindowWidth((Header *)0x12f20c);
  local_4e8 = *pfVar7;
  if (local_4e8 < 0.0) {
    uVar4 = __cxa_allocate_exception(0x48);
    Iex_3_3::ArgExc::ArgExc((ArgExc *)in_stack_ffffffffffffe360,(char *)in_stack_ffffffffffffe358);
    __cxa_throw(uVar4,&Iex_3_3::ArgExc::typeinfo,Iex_3_3::ArgExc::~ArgExc);
  }
  if ((local_a & 1) != 0) {
    bVar3 = hasName((Header *)0x12f2a8);
    if (!bVar3) {
      uVar4 = __cxa_allocate_exception(0x48);
      Iex_3_3::ArgExc::ArgExc((ArgExc *)in_stack_ffffffffffffe360,(char *)in_stack_ffffffffffffe358)
      ;
      __cxa_throw(uVar4,&Iex_3_3::ArgExc::typeinfo,Iex_3_3::ArgExc::~ArgExc);
    }
    bVar3 = hasType((Header *)0x12f320);
    if (!bVar3) {
      uVar4 = __cxa_allocate_exception(0x48);
      Iex_3_3::ArgExc::ArgExc((ArgExc *)in_stack_ffffffffffffe360,(char *)in_stack_ffffffffffffe358)
      ;
      __cxa_throw(uVar4,&Iex_3_3::ArgExc::typeinfo,Iex_3_3::ArgExc::~ArgExc);
    }
  }
  bVar3 = hasType((Header *)0x12f39a);
  local_512 = 0;
  if (bVar3) {
    psVar8 = type_abi_cxx11_((Header *)0x12f3b5);
    std::__cxx11::string::string(local_510,(string *)psVar8);
  }
  else {
    std::allocator<char>::allocator();
    local_512 = 1;
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffe3a0,in_stack_ffffffffffffe398,in_stack_ffffffffffffe390);
  }
  if ((local_512 & 1) != 0) {
    std::allocator<char>::~allocator(&local_511);
  }
  local_4f0 = local_510;
  bVar3 = std::operator!=(in_stack_ffffffffffffe360,(char *)in_stack_ffffffffffffe358);
  if ((!bVar3) || (bVar3 = isSupportedType(in_stack_ffffffffffffe360), bVar3)) {
    local_519 = isDeepData(in_stack_ffffffffffffe360);
    pLVar9 = Header::lineOrder((Header *)0x12f508);
    local_520 = *pLVar9;
    if ((local_9 & 1) == 0) {
      if ((local_520 != INCREASING_Y) && (local_520 != DECREASING_Y)) {
        uVar4 = __cxa_allocate_exception(0x48);
        Iex_3_3::ArgExc::ArgExc
                  ((ArgExc *)in_stack_ffffffffffffe360,(char *)in_stack_ffffffffffffe358);
        __cxa_throw(uVar4,&Iex_3_3::ArgExc::typeinfo,Iex_3_3::ArgExc::~ArgExc);
      }
    }
    else {
      bVar3 = hasTileDescription((Header *)0x12f53e);
      if (!bVar3) {
        uVar4 = __cxa_allocate_exception(0x48);
        Iex_3_3::ArgExc::ArgExc
                  ((ArgExc *)in_stack_ffffffffffffe360,(char *)in_stack_ffffffffffffe358);
        __cxa_throw(uVar4,&Iex_3_3::ArgExc::typeinfo,Iex_3_3::ArgExc::~ArgExc);
      }
      local_528 = tileDescription((Header *)0x12f5cd);
      if ((((local_528->xSize == 0) || (local_528->ySize == 0)) || (0x7fffffff < local_528->xSize))
         || (0x7fffffff < local_528->ySize)) {
        uVar4 = __cxa_allocate_exception(0x48);
        Iex_3_3::ArgExc::ArgExc
                  ((ArgExc *)in_stack_ffffffffffffe360,(char *)in_stack_ffffffffffffe358);
        __cxa_throw(uVar4,&Iex_3_3::ArgExc::typeinfo,Iex_3_3::ArgExc::~ArgExc);
      }
      if ((0 < (anonymous_namespace)::maxTileWidth) &&
         ((anonymous_namespace)::maxTileWidth < (int)local_528->xSize)) {
        iex_debugTrap();
        std::__cxx11::stringstream::stringstream(local_6b0);
        poVar5 = std::operator<<(local_6a0,"The width of the tiles exceeds the maximum width of ");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,(anonymous_namespace)::maxTileWidth);
        std::operator<<(poVar5,"pixels.");
        uVar4 = __cxa_allocate_exception(0x48);
        Iex_3_3::ArgExc::ArgExc((ArgExc *)in_stack_ffffffffffffe360,in_stack_ffffffffffffe358);
        __cxa_throw(uVar4,&Iex_3_3::ArgExc::typeinfo,Iex_3_3::ArgExc::~ArgExc);
      }
      if ((0 < (anonymous_namespace)::maxTileHeight) &&
         ((anonymous_namespace)::maxTileHeight < (int)local_528->ySize)) {
        iex_debugTrap();
        std::__cxx11::stringstream::stringstream(local_838);
        poVar5 = std::operator<<(local_828,"The width of the tiles exceeds the maximum width of ");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,(anonymous_namespace)::maxTileHeight);
        std::operator<<(poVar5,"pixels.");
        uVar4 = __cxa_allocate_exception(0x48);
        Iex_3_3::ArgExc::ArgExc((ArgExc *)in_stack_ffffffffffffe360,in_stack_ffffffffffffe358);
        __cxa_throw(uVar4,&Iex_3_3::ArgExc::typeinfo,Iex_3_3::ArgExc::~ArgExc);
      }
      if (((local_528->mode != ONE_LEVEL) && (local_528->mode != MIPMAP_LEVELS)) &&
         (local_528->mode != RIPMAP_LEVELS)) {
        uVar4 = __cxa_allocate_exception(0x48);
        Iex_3_3::ArgExc::ArgExc
                  ((ArgExc *)in_stack_ffffffffffffe360,(char *)in_stack_ffffffffffffe358);
        __cxa_throw(uVar4,&Iex_3_3::ArgExc::typeinfo,Iex_3_3::ArgExc::~ArgExc);
      }
      if ((local_528->roundingMode != ROUND_UP) && (local_528->roundingMode != ROUND_DOWN)) {
        uVar4 = __cxa_allocate_exception(0x48);
        Iex_3_3::ArgExc::ArgExc
                  ((ArgExc *)in_stack_ffffffffffffe360,(char *)in_stack_ffffffffffffe358);
        __cxa_throw(uVar4,&Iex_3_3::ArgExc::typeinfo,Iex_3_3::ArgExc::~ArgExc);
      }
      if (((local_520 != INCREASING_Y) && (local_520 != DECREASING_Y)) && (local_520 != RANDOM_Y)) {
        uVar4 = __cxa_allocate_exception(0x48);
        Iex_3_3::ArgExc::ArgExc
                  ((ArgExc *)in_stack_ffffffffffffe360,(char *)in_stack_ffffffffffffe358);
        __cxa_throw(uVar4,&Iex_3_3::ArgExc::typeinfo,Iex_3_3::ArgExc::~ArgExc);
      }
      getTiledChunkOffsetTableSize(in_stack_ffffffffffffe420);
    }
    pCVar10 = compression((Header *)0x12fb1b);
    bVar3 = isValidCompression(*pCVar10);
    if (!bVar3) {
      uVar4 = __cxa_allocate_exception(0x48);
      Iex_3_3::ArgExc::ArgExc((ArgExc *)in_stack_ffffffffffffe360,(char *)in_stack_ffffffffffffe358)
      ;
      __cxa_throw(uVar4,&Iex_3_3::ArgExc::typeinfo,Iex_3_3::ArgExc::~ArgExc);
    }
    if ((local_519 & 1) != 0) {
      pCVar10 = compression((Header *)0x12fbd1);
      bVar3 = isValidDeepCompression(*pCVar10);
      if (!bVar3) {
        uVar4 = __cxa_allocate_exception(0x48);
        Iex_3_3::ArgExc::ArgExc
                  ((ArgExc *)in_stack_ffffffffffffe360,(char *)in_stack_ffffffffffffe358);
        __cxa_throw(uVar4,&Iex_3_3::ArgExc::typeinfo,Iex_3_3::ArgExc::~ArgExc);
      }
    }
    local_840 = Header::channels((Header *)0x12fc7b);
    local_848._M_node = (_Base_ptr)ChannelList::begin((ChannelList *)in_stack_ffffffffffffe358);
    local_850._M_node = (_Base_ptr)ChannelList::end((ChannelList *)in_stack_ffffffffffffe358);
    bVar3 = Imf_3_3::operator==((ConstIterator *)in_stack_ffffffffffffe360,
                                (ConstIterator *)in_stack_ffffffffffffe358);
    if (bVar3) {
      iex_debugTrap();
      std::__cxx11::stringstream::stringstream(local_9d8);
      std::operator<<(local_9c8,"Missing or empty channel list in header");
      uVar4 = __cxa_allocate_exception(0x48);
      Iex_3_3::ArgExc::ArgExc((ArgExc *)in_stack_ffffffffffffe360,in_stack_ffffffffffffe358);
      __cxa_throw(uVar4,&Iex_3_3::ArgExc::typeinfo,Iex_3_3::ArgExc::~ArgExc);
    }
    if (((local_9 & 1) == 0) && ((local_519 & 1) == 0)) {
      local_e88._M_node = (_Base_ptr)ChannelList::begin((ChannelList *)in_stack_ffffffffffffe358);
      while( true ) {
        local_e90._M_node = (_Base_ptr)ChannelList::end((ChannelList *)in_stack_ffffffffffffe358);
        bVar3 = Imf_3_3::operator!=((ConstIterator *)in_stack_ffffffffffffe360,
                                    (ConstIterator *)in_stack_ffffffffffffe358);
        if (!bVar3) break;
        pCVar11 = ChannelList::ConstIterator::channel((ConstIterator *)0x130307);
        if (((pCVar11->type != UINT) &&
            (pCVar11 = ChannelList::ConstIterator::channel((ConstIterator *)0x13032f),
            pCVar11->type != HALF)) &&
           (pCVar11 = ChannelList::ConstIterator::channel((ConstIterator *)0x130357),
           pCVar11->type != FLOAT)) {
          iex_debugTrap();
          std::__cxx11::stringstream::stringstream(local_1018);
          poVar5 = std::operator<<(local_1008,"Pixel type of \"");
          pcVar12 = ChannelList::ConstIterator::name((ConstIterator *)0x1303b5);
          poVar5 = std::operator<<(poVar5,pcVar12);
          std::operator<<(poVar5,"\" image channel is invalid.");
          uVar4 = __cxa_allocate_exception(0x48);
          Iex_3_3::ArgExc::ArgExc((ArgExc *)in_stack_ffffffffffffe360,in_stack_ffffffffffffe358);
          __cxa_throw(uVar4,&Iex_3_3::ArgExc::typeinfo,Iex_3_3::ArgExc::~ArgExc);
        }
        pCVar11 = ChannelList::ConstIterator::channel((ConstIterator *)0x130491);
        if (pCVar11->xSampling < 1) {
          iex_debugTrap();
          std::__cxx11::stringstream::stringstream(local_11a0);
          poVar5 = std::operator<<(local_1190,"The x subsampling factor for the \"");
          pcVar12 = ChannelList::ConstIterator::name((ConstIterator *)0x1304f0);
          poVar5 = std::operator<<(poVar5,pcVar12);
          std::operator<<(poVar5,"\" channel is invalid.");
          uVar4 = __cxa_allocate_exception(0x48);
          Iex_3_3::ArgExc::ArgExc((ArgExc *)in_stack_ffffffffffffe360,in_stack_ffffffffffffe358);
          __cxa_throw(uVar4,&Iex_3_3::ArgExc::typeinfo,Iex_3_3::ArgExc::~ArgExc);
        }
        pCVar11 = ChannelList::ConstIterator::channel((ConstIterator *)0x1305cc);
        if (pCVar11->ySampling < 1) {
          iex_debugTrap();
          std::__cxx11::stringstream::stringstream(local_1328);
          poVar5 = std::operator<<(local_1318,"The y subsampling factor for the \"");
          pcVar12 = ChannelList::ConstIterator::name((ConstIterator *)0x13062b);
          poVar5 = std::operator<<(poVar5,pcVar12);
          std::operator<<(poVar5,"\" channel is invalid.");
          uVar4 = __cxa_allocate_exception(0x48);
          Iex_3_3::ArgExc::ArgExc((ArgExc *)in_stack_ffffffffffffe360,in_stack_ffffffffffffe358);
          __cxa_throw(uVar4,&Iex_3_3::ArgExc::typeinfo,Iex_3_3::ArgExc::~ArgExc);
        }
        iVar1 = (local_30->min).x;
        pCVar11 = ChannelList::ConstIterator::channel((ConstIterator *)0x130718);
        if (iVar1 % pCVar11->xSampling != 0) {
          iex_debugTrap();
          std::__cxx11::stringstream::stringstream(local_14b0);
          poVar5 = std::operator<<(local_14a0,
                                   "The minimum x coordinate of the image\'s data window is not a multiple of the x subsampling factor of the \""
                                  );
          pcVar12 = ChannelList::ConstIterator::name((ConstIterator *)0x130781);
          poVar5 = std::operator<<(poVar5,pcVar12);
          std::operator<<(poVar5,"\" channel.");
          uVar4 = __cxa_allocate_exception(0x48);
          Iex_3_3::ArgExc::ArgExc((ArgExc *)in_stack_ffffffffffffe360,in_stack_ffffffffffffe358);
          __cxa_throw(uVar4,&Iex_3_3::ArgExc::typeinfo,Iex_3_3::ArgExc::~ArgExc);
        }
        iVar1 = (local_30->min).y;
        pCVar11 = ChannelList::ConstIterator::channel((ConstIterator *)0x13086f);
        if (iVar1 % pCVar11->ySampling != 0) {
          iex_debugTrap();
          std::__cxx11::stringstream::stringstream(local_1638);
          poVar5 = std::operator<<(local_1628,
                                   "The minimum y coordinate of the image\'s data window is not a multiple of the y subsampling factor of the \""
                                  );
          pcVar12 = ChannelList::ConstIterator::name((ConstIterator *)0x1308d5);
          poVar5 = std::operator<<(poVar5,pcVar12);
          std::operator<<(poVar5,"\" channel.");
          uVar4 = __cxa_allocate_exception(0x48);
          Iex_3_3::ArgExc::ArgExc((ArgExc *)in_stack_ffffffffffffe360,in_stack_ffffffffffffe358);
          __cxa_throw(uVar4,&Iex_3_3::ArgExc::typeinfo,Iex_3_3::ArgExc::~ArgExc);
        }
        iVar1 = (local_30->min).x;
        iVar2 = (local_30->max).x;
        pCVar11 = ChannelList::ConstIterator::channel((ConstIterator *)0x1309ae);
        if (((iVar2 - iVar1) + 1) % pCVar11->xSampling != 0) {
          iex_debugTrap();
          std::__cxx11::stringstream::stringstream(local_17c0);
          poVar5 = std::operator<<(local_17b0,
                                   "Number of pixels per row in the image\'s data window is not a multiple of the x subsampling factor of the \""
                                  );
          pcVar12 = ChannelList::ConstIterator::name((ConstIterator *)0x130a0b);
          poVar5 = std::operator<<(poVar5,pcVar12);
          std::operator<<(poVar5,"\" channel.");
          uVar4 = __cxa_allocate_exception(0x48);
          Iex_3_3::ArgExc::ArgExc((ArgExc *)in_stack_ffffffffffffe360,in_stack_ffffffffffffe358);
          __cxa_throw(uVar4,&Iex_3_3::ArgExc::typeinfo,Iex_3_3::ArgExc::~ArgExc);
        }
        iVar1 = (local_30->min).y;
        iVar2 = (local_30->max).y;
        pCVar11 = ChannelList::ConstIterator::channel((ConstIterator *)0x130ae5);
        if (((iVar2 - iVar1) + 1) % pCVar11->ySampling != 0) {
          iex_debugTrap();
          std::__cxx11::stringstream::stringstream(local_1948);
          poVar5 = std::operator<<(local_1938,
                                   "Number of pixels per column in the image\'s data window is not a multiple of the y subsampling factor of the \""
                                  );
          pcVar12 = ChannelList::ConstIterator::name((ConstIterator *)0x130b42);
          poVar5 = std::operator<<(poVar5,pcVar12);
          std::operator<<(poVar5,"\" channel.");
          text = (stringstream *)__cxa_allocate_exception(0x48);
          Iex_3_3::ArgExc::ArgExc((ArgExc *)poVar5,text);
          __cxa_throw(text,&Iex_3_3::ArgExc::typeinfo,Iex_3_3::ArgExc::~ArgExc);
        }
        ChannelList::ConstIterator::operator++((ConstIterator *)in_stack_ffffffffffffe360);
      }
    }
    else {
      local_9e0._M_node = (_Base_ptr)ChannelList::begin((ChannelList *)in_stack_ffffffffffffe358);
      while( true ) {
        local_9e8._M_node = (_Base_ptr)ChannelList::end((ChannelList *)in_stack_ffffffffffffe358);
        bVar3 = Imf_3_3::operator!=((ConstIterator *)in_stack_ffffffffffffe360,
                                    (ConstIterator *)in_stack_ffffffffffffe358);
        if (!bVar3) break;
        pCVar11 = ChannelList::ConstIterator::channel((ConstIterator *)0x12fe70);
        if (((pCVar11->type != UINT) &&
            (pCVar11 = ChannelList::ConstIterator::channel((ConstIterator *)0x12fe98),
            pCVar11->type != HALF)) &&
           (pCVar11 = ChannelList::ConstIterator::channel((ConstIterator *)0x12fec0),
           pCVar11->type != FLOAT)) {
          iex_debugTrap();
          std::__cxx11::stringstream::stringstream(local_b70);
          poVar5 = std::operator<<(local_b60,"Pixel type of \"");
          pcVar12 = ChannelList::ConstIterator::name((ConstIterator *)0x12ff1e);
          poVar5 = std::operator<<(poVar5,pcVar12);
          std::operator<<(poVar5,"\" image channel is invalid.");
          uVar4 = __cxa_allocate_exception(0x48);
          Iex_3_3::ArgExc::ArgExc((ArgExc *)in_stack_ffffffffffffe360,in_stack_ffffffffffffe358);
          __cxa_throw(uVar4,&Iex_3_3::ArgExc::typeinfo,Iex_3_3::ArgExc::~ArgExc);
        }
        pCVar11 = ChannelList::ConstIterator::channel((ConstIterator *)0x12fffa);
        if (pCVar11->xSampling != 1) {
          iex_debugTrap();
          std::__cxx11::stringstream::stringstream(local_cf8);
          poVar5 = std::operator<<(local_ce8,"The x subsampling factor for the \"");
          pcVar12 = ChannelList::ConstIterator::name((ConstIterator *)0x130059);
          poVar5 = std::operator<<(poVar5,pcVar12);
          std::operator<<(poVar5,"\" channel is not 1.");
          uVar4 = __cxa_allocate_exception(0x48);
          Iex_3_3::ArgExc::ArgExc((ArgExc *)in_stack_ffffffffffffe360,in_stack_ffffffffffffe358);
          __cxa_throw(uVar4,&Iex_3_3::ArgExc::typeinfo,Iex_3_3::ArgExc::~ArgExc);
        }
        pCVar11 = ChannelList::ConstIterator::channel((ConstIterator *)0x130135);
        if (pCVar11->ySampling != 1) {
          iex_debugTrap();
          std::__cxx11::stringstream::stringstream(local_e80);
          poVar5 = std::operator<<(local_e70,"The y subsampling factor for the \"");
          pcVar12 = ChannelList::ConstIterator::name((ConstIterator *)0x130194);
          poVar5 = std::operator<<(poVar5,pcVar12);
          std::operator<<(poVar5,"\" channel is not 1.");
          uVar4 = __cxa_allocate_exception(0x48);
          Iex_3_3::ArgExc::ArgExc((ArgExc *)in_stack_ffffffffffffe360,in_stack_ffffffffffffe358);
          __cxa_throw(uVar4,&Iex_3_3::ArgExc::typeinfo,Iex_3_3::ArgExc::~ArgExc);
        }
        ChannelList::ConstIterator::operator++((ConstIterator *)in_stack_ffffffffffffe360);
      }
    }
    local_518 = 0;
  }
  else {
    local_518 = 1;
  }
  std::__cxx11::string::~string(local_510);
  return;
}

Assistant:

void
Header::sanityCheck (bool isTiled, bool isMultipartFile) const
{
    //
    // The display window and the data window must each
    // contain at least one pixel.  In addition, the
    // coordinates of the window corners must be small
    // enough to keep expressions like max-min+1 or
    // max+min from overflowing.
    //

    const Box2i& displayWindow = this->displayWindow ();

    if (displayWindow.min.x > displayWindow.max.x ||
        displayWindow.min.y > displayWindow.max.y ||
        displayWindow.min.x <= -(INT_MAX / 2) ||
        displayWindow.min.y <= -(INT_MAX / 2) ||
        displayWindow.max.x >= (INT_MAX / 2) ||
        displayWindow.max.y >= (INT_MAX / 2))
    {
        throw IEX_NAMESPACE::ArgExc ("Invalid display window in image header.");
    }

    const Box2i& dataWindow = this->dataWindow ();

    if (dataWindow.min.x > dataWindow.max.x ||
        dataWindow.min.y > dataWindow.max.y ||
        dataWindow.min.x <= -(INT_MAX / 2) ||
        dataWindow.min.y <= -(INT_MAX / 2) ||
        dataWindow.max.x >= (INT_MAX / 2) || dataWindow.max.y >= (INT_MAX / 2))
    {
        throw IEX_NAMESPACE::ArgExc ("Invalid data window in image header.");
    }

    int w = (dataWindow.max.x - dataWindow.min.x + 1);
    if (maxImageWidth > 0 && maxImageWidth < w)
    {
        THROW (
            IEX_NAMESPACE::ArgExc,
            "The width of the data window exceeds the "
            "maximum width of "
                << maxImageWidth << "pixels.");
    }

    int h = (dataWindow.max.y - dataWindow.min.y + 1);
    if (maxImageHeight > 0 && maxImageHeight < h)
    {
        THROW (
            IEX_NAMESPACE::ArgExc,
            "The height of the data window exceeds the "
            "maximum height of "
                << maxImageHeight << "pixels.");
    }

    // chunk table must be smaller than the maximum image area
    // (only reachable for unknown types or damaged files: will have thrown earlier
    //  for regular image types)
    if (maxImageHeight > 0 && maxImageWidth > 0 && hasChunkCount () &&
        static_cast<uint64_t> (chunkCount ()) >
            uint64_t (maxImageWidth) * uint64_t (maxImageHeight))
    {
        THROW (
            IEX_NAMESPACE::ArgExc,
            "chunkCount exceeds maximum area of "
                << uint64_t (maxImageWidth) * uint64_t (maxImageHeight)
                << " pixels.");
    }

    //
    // The pixel aspect ratio must be greater than 0.
    // In applications, numbers like the display or the
    // data window dimensions are likely to be multiplied
    // or divided by the pixel aspect ratio; to avoid
    // arithmetic exceptions, we limit the pixel aspect
    // ratio to a range that is smaller than theoretically
    // possible (real aspect ratios are likely to be close
    // to 1.0 anyway).
    //

    float pixelAspectRatio = this->pixelAspectRatio ();

    const float MIN_PIXEL_ASPECT_RATIO = 1e-6f;
    const float MAX_PIXEL_ASPECT_RATIO = 1e+6f;

    if (!std::isnormal (pixelAspectRatio) ||
        pixelAspectRatio < MIN_PIXEL_ASPECT_RATIO ||
        pixelAspectRatio > MAX_PIXEL_ASPECT_RATIO)
    {
        throw IEX_NAMESPACE::ArgExc (
            "Invalid pixel aspect ratio in image header.");
    }

    //
    // The screen window width must not be less than 0.
    // The size of the screen window can vary over a wide
    // range (fish-eye lens to astronomical telescope),
    // so we can't limit the screen window width to a
    // small range.
    //

    float screenWindowWidth = this->screenWindowWidth ();

    if (screenWindowWidth < 0)
        throw IEX_NAMESPACE::ArgExc (
            "Invalid screen window width in image header.");

    //
    // If the file has multiple parts, verify that each header has attribute
    // name and type.
    // (TODO) We may want to check more stuff here.
    //

    if (isMultipartFile)
    {
        if (!hasName ())
        {
            throw IEX_NAMESPACE::ArgExc ("Headers in a multipart file should"
                                         " have name attribute.");
        }

        if (!hasType ())
        {
            throw IEX_NAMESPACE::ArgExc ("Headers in a multipart file should"
                                         " have type attribute.");
        }
    }

    const std::string& part_type = hasType () ? type () : "";

    if (part_type != "" && !isSupportedType (part_type))
    {
        //
        // skip remaining sanity checks with unsupported types - they may not hold
        //
        return;
    }

    bool isDeep = isDeepData (part_type);

    //
    // If the file is tiled, verify that the tile description has reasonable
    // values and check to see if the lineOrder is one of the predefined 3.
    // If the file is not tiled, then the lineOrder can only be INCREASING_Y
    // or DECREASING_Y.
    //

    LineOrder lineOrder = this->lineOrder ();

    if (isTiled)
    {
        if (!hasTileDescription ())
        {
            throw IEX_NAMESPACE::ArgExc ("Tiled image has no tile "
                                         "description attribute.");
        }

        const TileDescription& tileDesc = tileDescription ();

        if (tileDesc.xSize <= 0 || tileDesc.ySize <= 0 ||
            tileDesc.xSize > INT_MAX || tileDesc.ySize > INT_MAX)
            throw IEX_NAMESPACE::ArgExc ("Invalid tile size in image header.");

        if (maxTileWidth > 0 && maxTileWidth < int (tileDesc.xSize))
        {
            THROW (
                IEX_NAMESPACE::ArgExc,
                "The width of the tiles exceeds the maximum "
                "width of "
                    << maxTileWidth << "pixels.");
        }

        if (maxTileHeight > 0 && maxTileHeight < int (tileDesc.ySize))
        {
            THROW (
                IEX_NAMESPACE::ArgExc,
                "The width of the tiles exceeds the maximum "
                "width of "
                    << maxTileHeight << "pixels.");
        }

        if (tileDesc.mode != ONE_LEVEL && tileDesc.mode != MIPMAP_LEVELS &&
            tileDesc.mode != RIPMAP_LEVELS)
            throw IEX_NAMESPACE::ArgExc ("Invalid level mode in image header.");

        if (tileDesc.roundingMode != ROUND_UP &&
            tileDesc.roundingMode != ROUND_DOWN)
            throw IEX_NAMESPACE::ArgExc (
                "Invalid level rounding mode in image header.");

        if (lineOrder != INCREASING_Y && lineOrder != DECREASING_Y &&
            lineOrder != RANDOM_Y)
            throw IEX_NAMESPACE::ArgExc ("Invalid line order in image header.");

        // computes size of chunk offset table. Throws an exception if this exceeds
        // the maximum allowable size
        getTiledChunkOffsetTableSize (*this);
    }
    else
    {
        if (lineOrder != INCREASING_Y && lineOrder != DECREASING_Y)
            throw IEX_NAMESPACE::ArgExc ("Invalid line order in image header.");
    }

    //
    // The compression method must be one of the predefined values.
    //

    if (!isValidCompression (this->compression ()))
        throw IEX_NAMESPACE::ArgExc (
            "Unknown compression type in image header.");

    if (isDeep)
    {
        if (!isValidDeepCompression (this->compression ()))
            throw IEX_NAMESPACE::ArgExc (
                "Compression type in header not valid for deep data");
    }

    //
    // Check the channel list:
    //
    // If the file is tiled then for each channel, the type must be one of the
    // predefined values, and the x and y sampling must both be 1.
    //
    // x and y sampling must currently also be 1 for deep scanline images
    //
    // If the file is not tiled then for each channel, the type must be one
    // of the predefined values, the x and y coordinates of the data window's
    // upper left corner must be divisible by the x and y subsampling factors,
    // and the width and height of the data window must be divisible by the
    // x and y subsampling factors.
    //

    const ChannelList& channels = this->channels ();

    if (channels.begin () == channels.end ())
    {
        THROW (
            IEX_NAMESPACE::ArgExc, "Missing or empty channel list in header");
    }

    if (isTiled || isDeep)
    {
        for (ChannelList::ConstIterator i = channels.begin ();
             i != channels.end ();
             ++i)
        {
            if (i.channel ().type != OPENEXR_IMF_INTERNAL_NAMESPACE::UINT &&
                i.channel ().type != OPENEXR_IMF_INTERNAL_NAMESPACE::HALF &&
                i.channel ().type != OPENEXR_IMF_INTERNAL_NAMESPACE::FLOAT)
            {
                THROW (
                    IEX_NAMESPACE::ArgExc,
                    "Pixel type of \"" << i.name ()
                                       << "\" "
                                          "image channel is invalid.");
            }

            if (i.channel ().xSampling != 1)
            {
                THROW (
                    IEX_NAMESPACE::ArgExc,
                    "The x subsampling factor for the "
                    "\"" << i.name ()
                         << "\" channel "
                            "is not 1.");
            }

            if (i.channel ().ySampling != 1)
            {
                THROW (
                    IEX_NAMESPACE::ArgExc,
                    "The y subsampling factor for the "
                    "\"" << i.name ()
                         << "\" channel "
                            "is not 1.");
            }
        }
    }
    else
    {
        for (ChannelList::ConstIterator i = channels.begin ();
             i != channels.end ();
             ++i)
        {
            if (i.channel ().type != OPENEXR_IMF_INTERNAL_NAMESPACE::UINT &&
                i.channel ().type != OPENEXR_IMF_INTERNAL_NAMESPACE::HALF &&
                i.channel ().type != OPENEXR_IMF_INTERNAL_NAMESPACE::FLOAT)
            {
                THROW (
                    IEX_NAMESPACE::ArgExc,
                    "Pixel type of \"" << i.name ()
                                       << "\" "
                                          "image channel is invalid.");
            }

            if (i.channel ().xSampling < 1)
            {
                THROW (
                    IEX_NAMESPACE::ArgExc,
                    "The x subsampling factor for the "
                    "\"" << i.name ()
                         << "\" channel "
                            "is invalid.");
            }

            if (i.channel ().ySampling < 1)
            {
                THROW (
                    IEX_NAMESPACE::ArgExc,
                    "The y subsampling factor for the "
                    "\"" << i.name ()
                         << "\" channel "
                            "is invalid.");
            }

            if (dataWindow.min.x % i.channel ().xSampling)
            {
                THROW (
                    IEX_NAMESPACE::ArgExc,
                    "The minimum x coordinate of the "
                    "image's data window is not a multiple "
                    "of the x subsampling factor of "
                    "the \""
                        << i.name () << "\" channel.");
            }

            if (dataWindow.min.y % i.channel ().ySampling)
            {
                THROW (
                    IEX_NAMESPACE::ArgExc,
                    "The minimum y coordinate of the "
                    "image's data window is not a multiple "
                    "of the y subsampling factor of "
                    "the \""
                        << i.name () << "\" channel.");
            }

            if ((dataWindow.max.x - dataWindow.min.x + 1) %
                i.channel ().xSampling)
            {
                THROW (
                    IEX_NAMESPACE::ArgExc,
                    "Number of pixels per row in the "
                    "image's data window is not a multiple "
                    "of the x subsampling factor of "
                    "the \""
                        << i.name () << "\" channel.");
            }

            if ((dataWindow.max.y - dataWindow.min.y + 1) %
                i.channel ().ySampling)
            {
                THROW (
                    IEX_NAMESPACE::ArgExc,
                    "Number of pixels per column in the "
                    "image's data window is not a multiple "
                    "of the y subsampling factor of "
                    "the \""
                        << i.name () << "\" channel.");
            }
        }
    }
}